

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

EnvironmentType parseEnvironment(StringRef EnvironmentName)

{
  int iVar1;
  EnvironmentType *pEVar2;
  ulong uVar3;
  long *__s1;
  Optional<llvm::Triple::EnvironmentType> local_20;
  
  uVar3 = EnvironmentName.Length;
  __s1 = (long *)EnvironmentName.Data;
  if ((uVar3 < 6) || (iVar1 = bcmp(__s1,"eabihf",6), iVar1 != 0)) {
    if ((uVar3 < 4) || ((int)*__s1 != 0x69626165)) {
      if ((uVar3 < 9) || (iVar1 = bcmp(__s1,"gnuabin32",9), iVar1 != 0)) {
        if ((uVar3 < 8) || (*__s1 != 0x3436696261756e67)) {
          if ((uVar3 < 9) || (iVar1 = bcmp(__s1,"gnueabihf",9), iVar1 != 0)) {
            if ((uVar3 < 7) || (iVar1 = bcmp(__s1,"gnueabi",7), iVar1 != 0)) {
              if (5 < uVar3) {
                iVar1 = bcmp(__s1,"gnux32",6);
                if (iVar1 == 0) {
                  local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x06';
                  local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
                  local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
                  local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
                  goto LAB_00173d84;
                }
                if ((5 < uVar3) && (iVar1 = bcmp(__s1,"code16",6), iVar1 == 0)) {
                  local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\a';
                  local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
                  local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
                  local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
                  goto LAB_00173d84;
                }
              }
              if ((uVar3 < 3) || (iVar1 = bcmp(__s1,"gnu",3), iVar1 != 0)) {
                if ((uVar3 < 7) || (iVar1 = bcmp(__s1,"android",7), iVar1 != 0)) {
                  if ((uVar3 < 10) || (iVar1 = bcmp(__s1,"musleabihf",10), iVar1 != 0)) {
                    if ((uVar3 < 8) || (*__s1 != 0x696261656c73756d)) {
                      if (3 < uVar3) {
                        if ((int)*__s1 == 0x6c73756d) {
                          local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\v'
                          ;
                          local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0'
                          ;
                          local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0'
                          ;
                          local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0'
                          ;
                          goto LAB_00173d84;
                        }
                        if ((3 < uVar3) && ((int)*__s1 == 0x6376736d)) {
                          local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] =
                               '\x0e';
                          local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0'
                          ;
                          local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0'
                          ;
                          local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0'
                          ;
                          goto LAB_00173d84;
                        }
                      }
                      if ((uVar3 < 7) || (iVar1 = bcmp(__s1,"itanium",7), iVar1 != 0)) {
                        if ((uVar3 < 6) || (iVar1 = bcmp(__s1,"cygnus",6), iVar1 != 0)) {
                          if ((uVar3 < 7) || (iVar1 = bcmp(__s1,"coreclr",7), iVar1 != 0)) {
                            if (uVar3 < 9) {
                              return UnknownEnvironment;
                            }
                            iVar1 = bcmp(__s1,"simulator",9);
                            if (iVar1 != 0) {
                              return UnknownEnvironment;
                            }
                            local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] =
                                 '\x12';
                            local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] =
                                 '\0';
                            local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] =
                                 '\0';
                            local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] =
                                 '\0';
                          }
                          else {
                            local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] =
                                 '\x11';
                            local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] =
                                 '\0';
                            local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] =
                                 '\0';
                            local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] =
                                 '\0';
                          }
                        }
                        else {
                          local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] =
                               '\x10';
                          local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0'
                          ;
                          local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0'
                          ;
                          local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0'
                          ;
                        }
                      }
                      else {
                        local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x0f'
                        ;
                        local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
                        local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
                        local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
                      }
                    }
                    else {
                      local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\f';
                      local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
                      local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
                      local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
                    }
                  }
                  else {
                    local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\r';
                    local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
                    local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
                    local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
                  }
                }
                else {
                  local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\n';
                  local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
                  local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
                  local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
                }
              }
              else {
                local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x01';
                local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
                local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
                local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
              }
            }
            else {
              local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x04';
              local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
              local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
              local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
            }
          }
          else {
            local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x05';
            local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
            local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
            local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
          }
        }
        else {
          local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x03';
          local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
          local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
          local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
        }
      }
      else {
        local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x02';
        local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
        local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
        local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
      }
    }
    else {
      local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\b';
      local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
      local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
      local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
    }
  }
  else {
    local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\t';
    local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
    local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
    local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
  }
LAB_00173d84:
  local_20.Storage.hasVal = true;
  pEVar2 = llvm::Optional<llvm::Triple::EnvironmentType>::getPointer(&local_20);
  return *pEVar2;
}

Assistant:

static Triple::EnvironmentType parseEnvironment(StringRef EnvironmentName) {
  return StringSwitch<Triple::EnvironmentType>(EnvironmentName)
    .StartsWith("eabihf", Triple::EABIHF)
    .StartsWith("eabi", Triple::EABI)
    .StartsWith("gnuabin32", Triple::GNUABIN32)
    .StartsWith("gnuabi64", Triple::GNUABI64)
    .StartsWith("gnueabihf", Triple::GNUEABIHF)
    .StartsWith("gnueabi", Triple::GNUEABI)
    .StartsWith("gnux32", Triple::GNUX32)
    .StartsWith("code16", Triple::CODE16)
    .StartsWith("gnu", Triple::GNU)
    .StartsWith("android", Triple::Android)
    .StartsWith("musleabihf", Triple::MuslEABIHF)
    .StartsWith("musleabi", Triple::MuslEABI)
    .StartsWith("musl", Triple::Musl)
    .StartsWith("msvc", Triple::MSVC)
    .StartsWith("itanium", Triple::Itanium)
    .StartsWith("cygnus", Triple::Cygnus)
    .StartsWith("coreclr", Triple::CoreCLR)
    .StartsWith("simulator", Triple::Simulator)
    .Default(Triple::UnknownEnvironment);
}